

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_gear(void)

{
  byte bVar1;
  int16_t iVar2;
  wchar_t wVar3;
  object *local_20;
  object *known_obj;
  object *obj;
  
  wVar3 = rd_gear_aux(rd_item,&player->gear);
  if (wVar3 == L'\0') {
    wVar3 = rd_gear_aux(rd_item,&player->gear_k);
    if (wVar3 == L'\0') {
      local_20 = player->gear_k;
      for (known_obj = player->gear; known_obj != (object *)0x0; known_obj = known_obj->next) {
        known_obj->known = local_20;
        bVar1 = known_obj->number;
        iVar2 = object_weight_one(known_obj);
        player->upkeep->total_weight = (uint)bVar1 * (int)iVar2 + player->upkeep->total_weight;
        local_20 = local_20->next;
      }
      calc_inventory(player);
      obj._4_4_ = L'\0';
    }
    else {
      obj._4_4_ = L'\xffffffff';
    }
  }
  else {
    obj._4_4_ = L'\xffffffff';
  }
  return obj._4_4_;
}

Assistant:

int rd_gear(void)
{
	struct object *obj, *known_obj;

	/* Get real gear */
	if (rd_gear_aux(rd_item, &player->gear))
		return -1;

	/* Get known gear */
	if (rd_gear_aux(rd_item, &player->gear_k))
		return -1;

	/* Align the two, add weight */
	for (obj = player->gear, known_obj = player->gear_k; obj;
		 obj = obj->next, known_obj = known_obj->next) {
		obj->known = known_obj;
		player->upkeep->total_weight +=
			obj->number * object_weight_one(obj);
	}

	calc_inventory(player);

	return 0;
}